

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<char>::append(SmallVectorImpl<char> *this,size_type NumInputs,char *Elt)

{
  ulong uVar1;
  ulong uVar2;
  size_t __len;
  
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
  if (uVar1 - uVar2 < NumInputs) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,uVar2 + NumInputs,1);
    uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  }
  else if (NumInputs == 0) goto LAB_001195f9;
  memset((void *)(uVar2 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX),(uint)(byte)*Elt,NumInputs);
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
LAB_001195f9:
  if (uVar2 + NumInputs <= uVar1) {
    (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)(uVar2 + NumInputs);
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(size_type NumInputs, const T &Elt) {
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    std::uninitialized_fill_n(this->end(), NumInputs, Elt);
    this->set_size(this->size() + NumInputs);
  }